

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAbstractButtonListModel.cpp
# Opt level: O0

bool __thiscall
QAbstractButtonListModel::insertRows
          (QAbstractButtonListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  parameter_type t;
  long n;
  long i;
  QModelIndex *in_RCX;
  int in_EDX;
  int in_ESI;
  QModelIndex *in_RDI;
  QList<QMap<int,_QVariant>_> *this_00;
  undefined1 local_40 [32];
  QModelIndex *local_20;
  int local_18;
  int local_14;
  
  if ((((0 < in_EDX) && (-1 < in_ESI)) &&
      (local_20 = in_RCX, local_18 = in_EDX, local_14 = in_ESI,
      iVar2 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,in_RCX), in_ESI <= iVar2)) &&
     (bVar1 = QModelIndex::isValid(local_20), !bVar1)) {
    QModelIndex::QModelIndex((QModelIndex *)(local_40 + 8));
    QAbstractItemModel::beginInsertRows(in_RDI,(int)(QModelIndex *)(local_40 + 8),local_14);
    t = (parameter_type)(*(long *)(in_RDI + 0x10) + 0x18);
    n = (long)local_14;
    i = (long)local_18;
    local_40._0_8_ = (Data *)0x0;
    this_00 = (QList<QMap<int,_QVariant>_> *)local_40;
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)0x1f56fb);
    QList<QMap<int,_QVariant>_>::insert(this_00,i,n,t);
    QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)0x1f572f);
    QAbstractItemModel::endInsertRows();
    return true;
  }
  return false;
}

Assistant:

bool QAbstractButtonListModel::insertRows(int row, int count, const QModelIndex &parent) {
    if (count < 1 || row < 0 || row > rowCount(parent) || parent.isValid()) {
        return false;
    }

    beginInsertRows(QModelIndex(), row, row + count - 1);
    d->buttons.insert(row, count, {});
    endInsertRows();

    return true;
}